

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildStructDeclaratorList(CNscPStackEntry *pList,CNscPStackEntry *pDeclarator)

{
  NscType NVar1;
  int iVar2;
  char *pcVar3;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  CNscPStackEntry *unaff_retaddr;
  int in_stack_00000010;
  UINT32 in_stack_00000018;
  CNscPStackEntry *pOut;
  int in_stack_ffffffffffffffb8;
  NscType in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int nFile;
  undefined4 in_stack_ffffffffffffffe0;
  CNscPStackEntry *pszIdentifier;
  
  pszIdentifier = in_RDI;
  if (in_RDI == (CNscPStackEntry *)0x0) {
    in_RDI = CNscContext::GetPStackEntry
                       ((CNscContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                        ,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  }
  NVar1 = CNscPStackEntry::GetType(in_RDI);
  if (NVar1 != NscType_Error) {
    pcVar3 = CNscPStackEntry::GetIdentifier(in_RSI);
    nFile = (int)((ulong)pcVar3 >> 0x20);
    NVar1 = (NscType)((ulong)in_RSI >> 0x20);
    iVar2 = CNscContext::GetFile(g_pCtx,0);
    in_stack_ffffffffffffffb8 = CNscContext::GetLine(g_pCtx,0);
    in_stack_ffffffffffffffc0 = 0;
    CNscPStackEntry::PushDeclaration
              (unaff_retaddr,(char *)pszIdentifier,NVar1,(uchar *)in_RDI,
               CONCAT44(iVar2,in_stack_ffffffffffffffe0),nFile,in_stack_00000010,in_stack_00000018);
  }
  CNscContext::FreePStackEntry
            ((CNscContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return in_RDI;
}

Assistant:

YYSTYPE NscBuildStructDeclaratorList (YYSTYPE pList, YYSTYPE pDeclarator)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	if (pOut ->GetType () != NscType_Error)
	{
		pOut ->PushDeclaration (pDeclarator ->GetIdentifier (),
			NscType_Unknown, NULL, 0, g_pCtx ->GetFile (0),
			g_pCtx ->GetLine (0), 0);
	}
	g_pCtx ->FreePStackEntry (pDeclarator);


	//
	// Return the new expression
	//

	return pOut;
}